

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratedFileStream.cxx
# Opt level: O1

void __thiscall cmGeneratedFileStream::~cmGeneratedFileStream(cmGeneratedFileStream *this)

{
  _func_int *p_Var1;
  
  p_Var1 = (this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
           _vptr_basic_ostream[-3];
  ~cmGeneratedFileStream
            ((cmGeneratedFileStream *)
             ((long)&(this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                     _vptr_basic_ostream + (long)p_Var1),&VTT);
  std::ios_base::~ios_base((ios_base *)(&(this->super_ofstream).field_0x140 + (long)p_Var1));
  return;
}

Assistant:

cmGeneratedFileStream::~cmGeneratedFileStream()
{
  // This is the first destructor called.  Check the status of the
  // stream and give the information to the private base.  Next the
  // stream will be destroyed which will close the temporary file.
  // Finally the base destructor will be called to replace the
  // destination file.
  this->Okay = (*this)?true:false;
}